

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<spirv_cross::SPIRVariable&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,SPIRVariable *p)

{
  size_t sVar1;
  uint32_t uVar2;
  ID IVar3;
  bool bVar4;
  undefined2 uVar5;
  bool bVar6;
  bool bVar7;
  BlockID BVar8;
  bool bVar9;
  bool bVar10;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var11;
  ulong uVar12;
  uint uVar13;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var14;
  SPIRVariable *pSVar15;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    uVar13 = this->start_object_count <<
             ((byte)(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                    .buffer_size & 0x1f);
    uVar12 = (ulong)uVar13;
    _Var11.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(uVar12 * 0xb0);
    if (_Var11.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
        (SPIRVariable *)0x0) {
      _Var14._M_head_impl =
           (SPIRVariable *)
           _Var11.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      if (uVar13 != 0) {
        do {
          SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar1] =
               _Var14._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar1 + 1;
          uVar12 = uVar12 - 1;
          _Var14._M_head_impl = _Var14._M_head_impl + 1;
        } while (uVar12 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
           _Var11.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var11.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
          (SPIRVariable *)0x0) goto LAB_0027800c;
    }
    pSVar15 = (SPIRVariable *)0x0;
  }
  else {
LAB_0027800c:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar15 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar15->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003d8280;
    (pSVar15->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar15->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003d85c8;
    uVar2 = p->decoration;
    IVar3.id = (p->initializer).id;
    *(undefined8 *)&(pSVar15->super_IVariant).field_0xc =
         *(undefined8 *)&(p->super_IVariant).field_0xc;
    pSVar15->decoration = uVar2;
    pSVar15->initializer = (ID)IVar3.id;
    (pSVar15->basevariable).id = (p->basevariable).id;
    (pSVar15->dereference_chain).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
    (pSVar15->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar15->dereference_chain).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar15->dereference_chain).stack_storage;
    (pSVar15->dereference_chain).buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar15->dereference_chain,&p->dereference_chain);
    bVar4 = p->statically_assigned;
    uVar5 = *(undefined2 *)&p->field_0x5a;
    IVar3.id = (p->static_expression).id;
    pSVar15->compat_builtin = p->compat_builtin;
    pSVar15->statically_assigned = bVar4;
    *(undefined2 *)&pSVar15->field_0x5a = uVar5;
    pSVar15->static_expression = (ID)IVar3.id;
    (pSVar15->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar15->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size
         = 0;
    (pSVar15->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar15->dependees).stack_storage;
    (pSVar15->dependees).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar15->dependees,&p->dependees);
    bVar4 = p->phi_variable;
    bVar6 = p->allocate_temporary_copy;
    bVar7 = p->remapped_variable;
    uVar2 = p->remapped_components;
    BVar8.id = (p->dominator).id;
    bVar9 = p->loop_variable;
    bVar10 = p->loop_variable_enable;
    uVar5 = *(undefined2 *)&p->field_0xa6;
    pSVar15->deferred_declaration = p->deferred_declaration;
    pSVar15->phi_variable = bVar4;
    pSVar15->allocate_temporary_copy = bVar6;
    pSVar15->remapped_variable = bVar7;
    pSVar15->remapped_components = uVar2;
    pSVar15->dominator = (BlockID)BVar8.id;
    pSVar15->loop_variable = bVar9;
    pSVar15->loop_variable_enable = bVar10;
    *(undefined2 *)&pSVar15->field_0xa6 = uVar5;
    pSVar15->parameter = p->parameter;
  }
  return pSVar15;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}